

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_mesh_builder.cxx
# Opt level: O1

bool __thiscall
xray_re::xr_mesh_builder::b_face::is_back
          (b_face *this,b_face *face,
          vector<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_> *normals,
          float normal_tolerance)

{
  long lVar1;
  uint uVar2;
  pointer p_Var3;
  bool bVar4;
  uint uVar5;
  long lVar6;
  long lVar8;
  ulong uVar9;
  ulong uVar7;
  
  uVar5 = (face->field_0).field_0.v[0];
  if ((this->field_0).field_0.v[0] == uVar5) {
    bVar4 = true;
    lVar8 = 0;
  }
  else {
    lVar6 = 0;
    do {
      bVar4 = lVar6 != 2;
      if (lVar6 == 2) goto LAB_001737c9;
      lVar8 = lVar6 + 1;
      lVar1 = lVar6 * 4;
      lVar6 = lVar8;
    } while (*(uint *)((long)&this->field_0 + lVar1 + 4) != uVar5);
  }
  uVar5 = 1 << ((byte)lVar8 & 0x1f) & 3;
  uVar7 = (ulong)uVar5;
  if ((((((this->field_0).__refs[uVar7] == (face->field_0).field_0.v[2]) &&
        (uVar9 = (ulong)(1 << (sbyte)uVar5 & 3),
        (this->field_0).__refs[uVar9] == (face->field_0).field_0.v[1])) &&
       (this->sector == face->sector)) &&
      ((this->field_1 == face->field_1 &&
       (*(uint32_t *)((long)&this->field_0 + lVar8 * 4 + 0x18) == (face->field_0).field_0.tc[0]))))
     && ((*(uint32_t *)((long)&this->field_0 + uVar7 * 4 + 0x18) == (face->field_0).field_0.tc[2] &&
         (*(uint32_t *)((long)&this->field_0 + uVar9 * 4 + 0x18) == (face->field_0).field_0.tc[1])))
     ) {
    uVar5 = *(uint *)((long)&this->field_0 + lVar8 * 4 + 0xc);
    p_Var3 = (normals->
             super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    uVar2 = (face->field_0).field_0.n[0];
    if (ABS(p_Var3[uVar2].field_0.field_0.x + p_Var3[uVar5].field_0.field_0.x) < normal_tolerance) {
      if ((ABS(p_Var3[uVar2].field_0.field_0.y + p_Var3[uVar5].field_0.field_0.y) < normal_tolerance
          ) && (ABS(p_Var3[uVar2].field_0.field_0.z + p_Var3[uVar5].field_0.field_0.z) <
                normal_tolerance)) {
        uVar5 = *(uint *)((long)&this->field_0 + uVar7 * 4 + 0xc);
        uVar2 = (face->field_0).field_0.n[2];
        if (ABS(p_Var3[uVar2].field_0.field_0.x + p_Var3[uVar5].field_0.field_0.x) <
            normal_tolerance) {
          if ((ABS(p_Var3[uVar2].field_0.field_0.y + p_Var3[uVar5].field_0.field_0.y) <
               normal_tolerance) &&
             (ABS(p_Var3[uVar2].field_0.field_0.z + p_Var3[uVar5].field_0.field_0.z) <
              normal_tolerance)) {
            uVar5 = *(uint *)((long)&this->field_0 + uVar9 * 4 + 0xc);
            uVar2 = (face->field_0).field_0.n[1];
            if (ABS(p_Var3[uVar2].field_0.field_0.x + p_Var3[uVar5].field_0.field_0.x) <
                normal_tolerance) {
              if (ABS(p_Var3[uVar2].field_0.field_0.y + p_Var3[uVar5].field_0.field_0.y) <
                  normal_tolerance) {
                uVar5 = (uint)(ABS(p_Var3[uVar2].field_0.field_0.z + p_Var3[uVar5].field_0.field_0.z
                                  ) < normal_tolerance);
                goto LAB_001737c9;
              }
            }
          }
        }
      }
    }
  }
  uVar5 = 0;
LAB_001737c9:
  return (bool)(bVar4 & (byte)uVar5);
}

Assistant:

bool xr_mesh_builder::b_face::is_back(const b_face& face,
		const std::vector<fvector3>& normals, float normal_tolerance) const
{
	for (uint_fast32_t i0 = 0; i0 != 3; ++i0) {
		if (v[i0] != face.v0)
			continue;
		uint_fast32_t i1 = (1 << i0) & 3;
		uint_fast32_t i2 = (1 << i1) & 3;
		return v[i1] == face.v2 && v[i2] == face.v1 &&
				sector == face.sector && surface == face.surface &&
				tc[i0] == face.tc0 && tc[i1] == face.tc2 && tc[i2] == face.tc1 &&
				normals[n[i0]].inverted(normals[face.n0], normal_tolerance) &&
				normals[n[i1]].inverted(normals[face.n2], normal_tolerance) &&
				normals[n[i2]].inverted(normals[face.n1], normal_tolerance);
	}
	return false;
}